

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

BOOL Js::TypedArrayBase::IsDetachedTypedArray(Var aValue)

{
  bool bVar1;
  TypedArrayBase *pTVar2;
  uint uVar3;
  
  bVar1 = VarIs<Js::TypedArrayBase>(aValue);
  uVar3 = 0;
  if (bVar1) {
    pTVar2 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
    uVar3 = 0;
    if (pTVar2 != (TypedArrayBase *)0x0) {
      uVar3 = (uint)((pTVar2->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached;
    }
  }
  return uVar3;
}

Assistant:

BOOL TypedArrayBase::IsDetachedTypedArray(Var aValue)
    {
        TypedArrayBase* arr = JavascriptOperators::TryFromVar<TypedArrayBase>(aValue);
        return arr && arr->IsDetachedBuffer();
    }